

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

node * list_insert_node(list *list,node *node)

{
  node *node_local;
  list *list_local;
  
  if ((list == (list *)0x0) || (node == (node *)0x0)) {
    list_local = (list *)0x0;
  }
  else if (list->head == (node *)0x0) {
    list->head = node;
    list->tail = node;
    list->size = list->size + 1;
    list_local = (list *)node;
  }
  else {
    list_local = (list *)list_insert_node_before(list,list->head,node);
  }
  return (node *)list_local;
}

Assistant:

struct node *list_insert_node(struct list *list, struct node *node)
{
        if (list == NULL || node == NULL) {
                return NULL;
        }

        if (list->head == NULL) {
                list->head = node;
                list->tail = node;

                ++list->size;

                return node;
        } else {
                return list_insert_node_before(list, list->head, node);
        }
}